

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

void Ssw_MatchingStart(Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairs)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_34;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Vec_Int_t *vPairs_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  local_34 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vPairs);
    if (iVar2 <= local_34) {
      pAVar3 = Aig_ManConst1(p0);
      pAVar4 = Aig_ManConst1(p1);
      if ((Aig_Obj_t *)(pAVar3->field_5).pData != pAVar4) {
        __assert_fail("pObj0->pData == pObj1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x53,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      if ((Aig_Obj_t *)(pAVar4->field_5).pData == pAVar3) {
        local_34 = 0;
        while( true ) {
          iVar2 = Saig_ManPiNum(p0);
          if (iVar2 <= local_34) {
            local_34 = 0;
            while( true ) {
              iVar2 = Vec_PtrSize(p0->vCos);
              if (iVar2 <= local_34) {
                for (local_34 = 0; iVar2 = Saig_ManRegNum(p0), local_34 < iVar2;
                    local_34 = local_34 + 1) {
                  pVVar1 = p0->vCis;
                  iVar2 = Saig_ManPiNum(p0);
                  pvVar5 = Vec_PtrEntry(pVVar1,local_34 + iVar2);
                  if ((*(long *)((long)pvVar5 + 0x28) != 0) &&
                     (iVar2 = Saig_ObjIsLo(p1,*(Aig_Obj_t **)((long)pvVar5 + 0x28)), iVar2 == 0)) {
                    Abc_Print(1,"Mismatch between LO pairs.\n");
                  }
                }
                for (local_34 = 0; iVar2 = Saig_ManRegNum(p1), local_34 < iVar2;
                    local_34 = local_34 + 1) {
                  pVVar1 = p1->vCis;
                  iVar2 = Saig_ManPiNum(p1);
                  pvVar5 = Vec_PtrEntry(pVVar1,local_34 + iVar2);
                  if ((*(long *)((long)pvVar5 + 0x28) != 0) &&
                     (iVar2 = Saig_ObjIsLo(p0,*(Aig_Obj_t **)((long)pvVar5 + 0x28)), iVar2 == 0)) {
                    Abc_Print(1,"Mismatch between LO pairs.\n");
                  }
                }
                return;
              }
              pvVar5 = Vec_PtrEntry(p0->vCos,local_34);
              pAVar3 = Aig_ManCo(p1,local_34);
              if (*(long *)((long)pvVar5 + 0x28) != 0) break;
              if ((pAVar3->field_5).pData != (void *)0x0) {
                __assert_fail("pObj1->pData == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                              ,0x61,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)")
                ;
              }
              local_34 = local_34 + 1;
            }
            __assert_fail("pObj0->pData == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                          ,0x60,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
          }
          pvVar5 = Vec_PtrEntry(p0->vCis,local_34);
          pAVar3 = Aig_ManCi(p1,local_34);
          if (*(Aig_Obj_t **)((long)pvVar5 + 0x28) != pAVar3) break;
          if ((pAVar3->field_5).pData != pvVar5) {
            __assert_fail("pObj1->pData == pObj0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                          ,0x5a,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
          }
          local_34 = local_34 + 1;
        }
        __assert_fail("pObj0->pData == pObj1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                      ,0x59,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      __assert_fail("pObj1->pData == pObj0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                    ,0x54,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
    }
    iVar2 = Vec_IntEntry(vPairs,local_34);
    pAVar3 = Aig_ManObj(p0,iVar2);
    iVar2 = Vec_IntEntry(vPairs,local_34 + 1);
    pAVar4 = Aig_ManObj(p1,iVar2);
    if ((pAVar3->field_5).pData != (void *)0x0) {
      __assert_fail("pObj0->pData == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                    ,0x4b,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
    }
    if ((pAVar4->field_5).pData != (void *)0x0) break;
    (pAVar3->field_5).pData = pAVar4;
    (pAVar4->field_5).pData = pAVar3;
    local_34 = local_34 + 2;
  }
  __assert_fail("pObj1->pData == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswIslands.c"
                ,0x4c,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

void Ssw_MatchingStart( Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairs )
{
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairs, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairs, i+1) );
        assert( pObj0->pData == NULL );
        assert( pObj1->pData == NULL );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // make sure constants are matched
    pObj0 = Aig_ManConst1( p0 );
    pObj1 = Aig_ManConst1( p1 );
    assert( pObj0->pData == pObj1 );
    assert( pObj1->pData == pObj0 );
    // make sure PIs are matched
    Saig_ManForEachPi( p0, pObj0, i )
    {
        pObj1 = Aig_ManCi( p1, i );
        assert( pObj0->pData == pObj1 );
        assert( pObj1->pData == pObj0 );
    }
    // make sure the POs are not matched
    Aig_ManForEachCo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        assert( pObj0->pData == NULL );
        assert( pObj1->pData == NULL );
    }

    // check that LIs/LOs are matched in sync
    Saig_ManForEachLo( p0, pObj0, i )
    {
        if ( pObj0->pData == NULL )
            continue;
        pObj1 = (Aig_Obj_t *)pObj0->pData;
        if ( !Saig_ObjIsLo(p1, pObj1) )
            Abc_Print( 1, "Mismatch between LO pairs.\n" );
    }
    Saig_ManForEachLo( p1, pObj1, i )
    {
        if ( pObj1->pData == NULL )
            continue;
        pObj0 = (Aig_Obj_t *)pObj1->pData;
        if ( !Saig_ObjIsLo(p0, pObj0) )
            Abc_Print( 1, "Mismatch between LO pairs.\n" );
    }
}